

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

int Ivy_CutReadLeaf(Ivy_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pFanin_00;
  int iLeaf;
  int nLats;
  Ivy_Obj_t *pFanin_local;
  
  iVar1 = Ivy_IsComplement(pFanin);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                  ,0x3ef,"int Ivy_CutReadLeaf(Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsLatch(pFanin);
  if (iVar1 == 0) {
    pFanin_local._4_4_ = Ivy_LeafCreate(pFanin->Id,0);
  }
  else {
    pFanin_00 = Ivy_ObjFanin0(pFanin);
    iVar1 = Ivy_CutReadLeaf(pFanin_00);
    iVar2 = Ivy_LeafLat(iVar1);
    if (0xfe < iVar2) {
      __assert_fail("nLats < IVY_LEAF_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x3f4,"int Ivy_CutReadLeaf(Ivy_Obj_t *)");
    }
    pFanin_local._4_4_ = iVar1 + 1;
  }
  return pFanin_local._4_4_;
}

Assistant:

static inline int Ivy_CutReadLeaf( Ivy_Obj_t * pFanin )
{
    int nLats, iLeaf;
    assert( !Ivy_IsComplement(pFanin) );
    if ( !Ivy_ObjIsLatch(pFanin) )
        return Ivy_LeafCreate( pFanin->Id, 0 );
    iLeaf = Ivy_CutReadLeaf(Ivy_ObjFanin0(pFanin));
    nLats = Ivy_LeafLat(iLeaf);
    assert( nLats < IVY_LEAF_MASK );
    return 1 + iLeaf;
}